

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageWriterTests.cpp
# Opt level: O1

bool anon_unknown.dwarf_26ebfc::IsCorrectData<MILBlob::Fp8E5M2>
               (string *filePath,uint64_t offset,
               Span<const_MILBlob::Fp8E5M2,_18446744073709551615UL> expectedSpan)

{
  bool bVar1;
  pointer __first1;
  SpanSize<18446744073709551615UL> in_R8;
  pointer ptVar2;
  Span<unsigned_char,_18446744073709551615UL> data;
  Span<MILBlob::Fp8E5M2,_18446744073709551615UL> data_00;
  vector<MILBlob::Fp8E5M2,_std::allocator<MILBlob::Fp8E5M2>_> output;
  blob_metadata metadata;
  allocator_type local_91;
  pointer local_90;
  vector<MILBlob::Fp8E5M2,_std::allocator<MILBlob::Fp8E5M2>_> local_88;
  undefined8 local_70;
  undefined8 local_68;
  string *psStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_90 = expectedSpan.m_ptr;
  local_70 = 0x1deadbeef;
  local_68 = 0;
  psStack_60 = (string *)0x0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  data.m_size.m_size = in_R8.m_size;
  data.m_ptr = (pointer)0x40;
  MILBlob::TestUtil::ReadBlobFile<unsigned_char>
            ((TestUtil *)filePath,(string *)offset,(uint64_t)&local_70,data);
  std::vector<MILBlob::Fp8E5M2,_std::allocator<MILBlob::Fp8E5M2>_>::vector
            (&local_88,expectedSpan.m_size.m_size.m_size,&local_91);
  ptVar2 = local_88.super__Vector_base<MILBlob::Fp8E5M2,_std::allocator<MILBlob::Fp8E5M2>_>._M_impl.
           super__Vector_impl_data._M_finish +
           -(long)local_88.super__Vector_base<MILBlob::Fp8E5M2,_std::allocator<MILBlob::Fp8E5M2>_>.
                  _M_impl.super__Vector_impl_data._M_start;
  __first1 = local_88.super__Vector_base<MILBlob::Fp8E5M2,_std::allocator<MILBlob::Fp8E5M2>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ptVar2 == (pointer)0x0) {
    __first1 = (Fp8E5M2 *)0x0;
  }
  data_00.m_size.m_size = in_R8.m_size;
  data_00.m_ptr = ptVar2;
  MILBlob::TestUtil::ReadBlobFile<MILBlob::Fp8E5M2>
            ((TestUtil *)filePath,psStack_60,(uint64_t)__first1,data_00);
  if (ptVar2 == (pointer)expectedSpan.m_size.m_size.m_size) {
    bVar1 = std::__equal<false>::equal<MILBlob::Fp8E5M2*,MILBlob::Fp8E5M2_const*>
                      (__first1,ptVar2 + (long)__first1,local_90);
  }
  else {
    bVar1 = false;
  }
  if (local_88.super__Vector_base<MILBlob::Fp8E5M2,_std::allocator<MILBlob::Fp8E5M2>_>._M_impl.
      super__Vector_impl_data._M_start != (Fp8E5M2 *)0x0) {
    operator_delete(local_88.super__Vector_base<MILBlob::Fp8E5M2,_std::allocator<MILBlob::Fp8E5M2>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<MILBlob::Fp8E5M2,_std::allocator<MILBlob::Fp8E5M2>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<MILBlob::Fp8E5M2,_std::allocator<MILBlob::Fp8E5M2>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

[[nodiscard]] bool IsCorrectData(const std::string& filePath, uint64_t offset, Util::Span<const T> expectedSpan)
{
    if constexpr (MILBlob::IsSubByteSized<T>::value) {
        return IsCorrectSubByteData(filePath, offset, expectedSpan);
    } else {
        return IsCorrectDataImpl(filePath, offset, expectedSpan);
    }
}